

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp_object.cpp:247:52)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_regexp_object_cpp:247:52)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  regexp_object *this_00;
  void *pvVar1;
  pointer v;
  gc_heap_ptr_untyped local_40;
  gc_heap_ptr_untyped local_30;
  
  anon_unknown_35::check_type((anon_unknown_35 *)&local_30,&(this->f).global,this_);
  this_00 = (regexp_object *)gc_heap_ptr_untyped::get(&local_30);
  pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  v = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_start;
  if (v == (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_finish) {
    v = (pointer)&value::undefined;
  }
  to_string((mjs *)&local_40,*(gc_heap **)((long)pvVar1 + 8),v);
  regexp_object::exec(__return_storage_ptr__,this_00,(string *)&local_40);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_30);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }